

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool readFile(string *filename,string *contents)

{
  byte bVar1;
  bool bVar2;
  istream *piVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278 [32];
  string local_258 [8];
  string str;
  istream local_228 [8];
  ifstream file;
  string *contents_local;
  string *filename_local;
  
  std::ifstream::ifstream(local_228,filename,8);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    filename_local._7_1_ = false;
  }
  else {
    std::__cxx11::string::string(local_258);
    while( true ) {
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_228,local_258);
      bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
      if (!bVar2) break;
      std::operator+(local_278,(char *)local_258);
      std::__cxx11::string::operator+=((string *)contents,(string *)local_278);
      std::__cxx11::string::~string((string *)local_278);
    }
    std::ifstream::close();
    filename_local._7_1_ = true;
    std::__cxx11::string::~string(local_258);
  }
  std::ifstream::~ifstream(local_228);
  return filename_local._7_1_;
}

Assistant:

static bool readFile(const std::string & filename, std::string & contents)
{
    std::ifstream file(filename);
    if(!file.is_open())
        return false;
    std::string str;
    while(std::getline(file, str))
        contents += str + "\n";
    file.close();
    return true;
}